

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  Arena *arena;
  int iVar1;
  uint uVar2;
  RepeatedPtrFieldBase *pRVar3;
  Rep *pRVar4;
  long lVar5;
  undefined4 extraout_var;
  MessageLite *this_00;
  LogMessage *this_01;
  Nonnull<const_char_*> pcVar6;
  uint uVar7;
  int extend_amount;
  RepeatedPtrFieldBase *unaff_R13;
  MessageLite *unaff_R14;
  void **unaff_R15;
  string_view sVar9;
  RepeatedPtrFieldBase local_48;
  RepeatedPtrFieldBase *pRVar8;
  
  if (from == this) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from,this,"&from != this");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) {
    MergeFrom<google::protobuf::MessageLite>();
LAB_00258110:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  uVar7 = from->current_size_;
  if ((int)uVar7 < 1) {
    MergeFrom<google::protobuf::MessageLite>(&local_48);
LAB_002580e1:
    pRVar8 = (RepeatedPtrFieldBase *)(ulong)uVar7;
    pRVar3 = &local_48;
    MergeFrom<google::protobuf::MessageLite>(pRVar3);
  }
  else {
    uVar7 = uVar7 + this->current_size_;
    iVar1 = this->capacity_proxy_ + 1;
    extend_amount = uVar7 - iVar1;
    if (extend_amount == 0 || (int)uVar7 < iVar1) {
      pRVar3 = this;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar4 = rep(this);
        pRVar3 = (RepeatedPtrFieldBase *)pRVar4->elements;
      }
      unaff_R15 = &pRVar3->tagged_rep_or_elem_ + this->current_size_;
    }
    else {
      unaff_R15 = InternalExtend(this,extend_amount);
    }
    unaff_R13 = from;
    if (((ulong)from->tagged_rep_or_elem_ & 1) != 0) {
      pRVar4 = rep(from);
      unaff_R13 = (RepeatedPtrFieldBase *)pRVar4->elements;
    }
    unaff_R14 = (MessageLite *)unaff_R13->tagged_rep_or_elem_;
    if (unaff_R14 == (MessageLite *)0x0) goto LAB_002580e1;
    iVar1 = from->current_size_;
    local_48.arena_._4_4_ = uVar7;
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar7 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar4 = rep(this);
      uVar7 = pRVar4->allocated_size;
    }
    pRVar8 = (RepeatedPtrFieldBase *)(&unaff_R13->tagged_rep_or_elem_ + iVar1);
    pRVar3 = this;
    if ((int)uVar7 <= this->current_size_) goto LAB_00257fb3;
  }
  iVar1 = MergeIntoClearedMessages(pRVar3,from);
  unaff_R15 = unaff_R15 + iVar1;
  unaff_R13 = (RepeatedPtrFieldBase *)(&unaff_R13->tagged_rep_or_elem_ + iVar1);
LAB_00257fb3:
  if (unaff_R13 < pRVar8) {
    arena = this->arena_;
    do {
      if ((long *)unaff_R13->tagged_rep_or_elem_ == (long *)0x0) {
        MergeFrom<google::protobuf::MessageLite>(&local_48);
LAB_0025805a:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                   ,0xf0,"TypeId::Get(**src) == TypeId::Get(*prototype)");
        sVar9 = MessageLite::GetTypeName((MessageLite *)unaff_R13->tagged_rep_or_elem_);
        this_01 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            ((LogMessage *)&local_48,sVar9);
        sVar9._M_str = " vs ";
        sVar9._M_len = 4;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_01,sVar9);
        sVar9 = MessageLite::GetTypeName(unaff_R14);
        absl::lts_20250127::log_internal::LogMessage::operator<<(this_01,sVar9);
        goto LAB_00258110;
      }
      lVar5 = (**(code **)(*unaff_R13->tagged_rep_or_elem_ + 0x20))();
      iVar1 = (*unaff_R14->_vptr_MessageLite[4])(unaff_R14);
      if (lVar5 != CONCAT44(extraout_var,iVar1)) goto LAB_0025805a;
      this_00 = MessageLite::New(unaff_R14,arena);
      *unaff_R15 = this_00;
      MessageLite::CheckTypeAndMergeFrom(this_00,(MessageLite *)unaff_R13->tagged_rep_or_elem_);
      unaff_R13 = (RepeatedPtrFieldBase *)&unaff_R13->current_size_;
      unaff_R15 = unaff_R15 + 1;
    } while (unaff_R13 < pRVar8);
  }
  uVar7 = local_48.arena_._4_4_;
  this->current_size_ = local_48.arena_._4_4_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar2 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar4 = rep(this);
    uVar2 = pRVar4->allocated_size;
  }
  if ((int)uVar2 < (int)uVar7) {
    pRVar4 = rep(this);
    pRVar4->allocated_size = uVar7;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFrom<MessageLite>(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  ABSL_DCHECK(from.current_size_ > 0);
  int new_size = current_size_ + from.current_size_;
  auto dst = reinterpret_cast<MessageLite**>(InternalReserve(new_size));
  auto src = reinterpret_cast<MessageLite const* const*>(from.elements());
  auto end = src + from.current_size_;
  const MessageLite* prototype = src[0];
  ABSL_DCHECK(prototype != nullptr);
  if (ABSL_PREDICT_FALSE(ClearedCount() > 0)) {
    int recycled = MergeIntoClearedMessages(from);
    dst += recycled;
    src += recycled;
  }
  Arena* arena = GetArena();
  for (; src < end; ++src, ++dst) {
    ABSL_DCHECK(*src != nullptr);
    ABSL_DCHECK(TypeId::Get(**src) == TypeId::Get(*prototype))
        << (**src).GetTypeName() << " vs " << prototype->GetTypeName();
    *dst = prototype->New(arena);
    (*dst)->CheckTypeAndMergeFrom(**src);
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}